

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMatrix.cpp
# Opt level: O2

bool testMatrix(void)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  unsigned_long zz;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  unsigned_long bb;
  unsigned_long aa;
  unsigned_long uVar13;
  unsigned_long uVar14;
  unsigned_long dd;
  unsigned_long uVar15;
  unsigned_long cc;
  unsigned_long uVar16;
  Matrix aa_2;
  Matrix bb_2;
  Matrix cc_2;
  TMatrix<double> local_80;
  
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                      ,"localTestMatrix",0x13f,"Test Matrix - Start");
  uVar9 = 0xf;
  tfs::TMatrix<long>::TMatrix((TMatrix<long> *)&aa_2,0xf,4,2,3);
  pdVar3 = aa_2.m_end;
  pdVar7 = aa_2.m_data;
  if (aa_2.m_count == 0x168) {
    if (aa_2.m_length == 0xb40) {
      if (aa_2.m_end == aa_2.m_data + 0x168) {
        if (aa_2.m_data != (double *)0x0) {
          memset(aa_2.m_data,0,0xb40);
        }
        pcVar12 = "Data element not zero";
        uVar16 = 0x27;
LAB_00110d92:
        if (pdVar7 < pdVar3) goto code_r0x00110d9b;
        if (aa_2.m_a == 0xf) {
          if (aa_2.m_b != 4) {
            pcVar12 = "Height != %lu";
            uVar16 = 0x2e;
            uVar9 = 4;
            goto LAB_0011101b;
          }
          if (aa_2.m_c != 2) {
            pcVar12 = "Depth != %lu";
            uVar16 = 0x31;
            uVar9 = 2;
            goto LAB_0011101b;
          }
          if (aa_2.m_d != 3) {
            pcVar12 = "4th dimension != %lu";
            uVar16 = 0x34;
            uVar9 = 3;
            goto LAB_0011101b;
          }
          lVar10 = 0;
          for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
            for (uVar15 = 0; uVar15 != 2; uVar15 = uVar15 + 1) {
              for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
                for (uVar13 = 0; uVar13 != 0xf; uVar13 = uVar13 + 1) {
                  lVar6 = tfs::TMatrix<long>::get
                                    ((TMatrix<long> *)&aa_2,uVar13,uVar14,uVar15,uVar16);
                  tfs::TMatrix<long>::set
                            ((TMatrix<long> *)&aa_2,uVar13,uVar14,uVar15,uVar16,lVar6 + lVar10);
                  tfs::TMatrix<long>::plusEquals
                            ((TMatrix<long> *)&aa_2,uVar13,uVar14,uVar15,uVar16,lVar10 + 1);
                  lVar10 = lVar10 + 2;
                }
              }
            }
          }
          lVar10 = 0;
          for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
            for (uVar15 = 0; uVar15 != 2; uVar15 = uVar15 + 1) {
              for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
                for (uVar13 = 0; uVar13 != 0xf; uVar13 = uVar13 + 1) {
                  tfs::TMatrix<long>::set
                            ((TMatrix<long> *)&aa_2,uVar13,uVar14,uVar15,uVar16,lVar10 + uVar13);
                }
                lVar10 = lVar10 + uVar13;
              }
            }
          }
          lVar10 = 0;
          for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
            lVar6 = lVar10;
            for (uVar15 = 0; uVar15 != 2; uVar15 = uVar15 + 1) {
              lVar11 = lVar6;
              for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
                for (uVar13 = 0; uVar13 != 0xf; uVar13 = uVar13 + 1) {
                  lVar8 = tfs::TMatrix<long>::get
                                    ((TMatrix<long> *)&aa_2,uVar13,uVar14,uVar15,uVar16);
                  if (lVar11 + uVar13 != lVar8) {
                    bVar4 = tfs::report_problem("Error",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                                ,"localTestMatrixSize",0x54,"value %lu != %lu",lVar8
                                                ,lVar11 + uVar13);
                    goto LAB_00110dc2;
                  }
                }
                lVar11 = lVar11 + 0xf;
              }
              lVar6 = lVar6 + 0x3c;
            }
            lVar10 = lVar10 + 0x78;
          }
          tfs::TMatrix<long>::~TMatrix((TMatrix<long> *)&aa_2);
          goto LAB_00110dd6;
        }
        pcVar12 = "Width != %lu";
        uVar16 = 0x2b;
LAB_0011101b:
        bVar4 = tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                    ,"localTestMatrixSize",uVar16,pcVar12,uVar9);
        goto LAB_00110dc2;
      }
      pcVar12 = "End pointers do not match";
      uVar16 = 0x22;
LAB_00110da6:
      bVar4 = tfs::report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                  ,"localTestMatrixSize",uVar16,pcVar12);
    }
    else {
      bVar4 = tfs::report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                  ,"localTestMatrixSize",0x1b,"Matrix count is not %lu, it is %lu",
                                  0xb40,aa_2.m_length);
    }
  }
  else {
    bVar4 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixSize",0x16,"Matrix count is not %lu, it is %lu",
                                0x168,aa_2.m_count);
  }
LAB_00110dc2:
  tfs::TMatrix<long>::~TMatrix((TMatrix<long> *)&aa_2);
  if (bVar4 == false) {
    return false;
  }
LAB_00110dd6:
  tfs::TMatrix<double>::TMatrix(&aa_2,3,1,1,1);
  tfs::TMatrix<double>::TMatrix(&bb_2,3,1,1,1);
  if ((((aa_2.m_data == (double *)0x0) || (aa_2.m_end < aa_2.m_data)) ||
      (bb_2.m_data == (double *)0x0)) || (bb_2.m_end < bb_2.m_data)) {
    bVar4 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixMath",99,"Poorly formed matrix");
LAB_0011107f:
    tfs::TMatrix<double>::~TMatrix(&bb_2);
    tfs::TMatrix<double>::~TMatrix(&aa_2);
    if (bVar4 == false) {
      return false;
    }
  }
  else {
    *aa_2.m_data = 1.0;
    aa_2.m_data[1] = 2.0;
    aa_2.m_data[2] = 3.0;
    *bb_2.m_data = 4.0;
    bb_2.m_data[1] = -5.0;
    bb_2.m_data[2] = 6.0;
    dVar1 = tfs::TMatrix<double>::dot(&aa_2,&bb_2);
    if ((dVar1 != 12.0) || (NAN(dVar1))) {
      pcVar12 = "dot product is not 12.0, it was %f";
      uVar16 = 0x6f;
LAB_00111063:
      bVar4 = tfs::report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                  ,"localTestMatrixMath",uVar16,pcVar12);
      goto LAB_0011107f;
    }
    dVar1 = tfs::TMatrix<double>::min(&aa_2);
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      pcVar12 = "min is not 1.0, it was %f";
      uVar16 = 0x73;
      goto LAB_00111063;
    }
    dVar1 = tfs::TMatrix<double>::max(&aa_2);
    if ((dVar1 != 3.0) || (NAN(dVar1))) {
      pcVar12 = "max is not 3.0, it was %f";
      uVar16 = 0x77;
      goto LAB_00111063;
    }
    dVar1 = tfs::TMatrix<double>::sum(&aa_2);
    if ((dVar1 != 6.0) || (NAN(dVar1))) {
      pcVar12 = "sum is not 6.0, it was %f";
      uVar16 = 0x7b;
      goto LAB_00111063;
    }
    dVar1 = tfs::TMatrix<double>::min(&bb_2);
    if ((dVar1 != -5.0) || (NAN(dVar1))) {
      pcVar12 = "min is not -5.0, it was %f";
      uVar16 = 0x7f;
      goto LAB_00111063;
    }
    dVar1 = tfs::TMatrix<double>::max(&bb_2);
    if ((dVar1 != 6.0) || (NAN(dVar1))) {
      pcVar12 = "max is not 6.0, it was %f";
      uVar16 = 0x83;
      goto LAB_00111063;
    }
    dVar1 = tfs::TMatrix<double>::sum(&bb_2);
    if ((dVar1 != 5.0) || (NAN(dVar1))) {
      pcVar12 = "sum is not 5.0, it was %f";
      uVar16 = 0x87;
      goto LAB_00111063;
    }
    if ((bb_2.m_data != (double *)0x0) && (bb_2.m_length != 0)) {
      memset(bb_2.m_data,0,bb_2.m_length);
    }
    dVar1 = tfs::TMatrix<double>::min(&bb_2);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      pcVar12 = "min is not 0.0, it was %f";
      uVar16 = 0x8c;
      goto LAB_00111063;
    }
    dVar1 = tfs::TMatrix<double>::max(&bb_2);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      pcVar12 = "max is not 0.0, it was %f";
      uVar16 = 0x90;
      goto LAB_00111063;
    }
    tfs::TMatrix<double>::randomize(&aa_2);
    tfs::TMatrix<double>::randomize(&bb_2);
    dVar1 = tfs::TMatrix<double>::dot(&aa_2,&bb_2);
    if ((dVar1 == 12.0) && (!NAN(dVar1))) {
      tfs::report_problem("Warn ",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                          ,"localTestMatrixMath",0x96,
                          "dot product of two random matrices is 12.0, this is a surprise");
    }
    tfs::TMatrix<double>::~TMatrix(&bb_2);
    tfs::TMatrix<double>::~TMatrix(&aa_2);
  }
  tfs::TMatrix<double>::TMatrix(&aa_2,3,1,1,1);
  tfs::TMatrix<double>::TMatrix(&bb_2,3,1,1,1);
  tfs::TMatrix<double>::set(&aa_2,0,0.0);
  tfs::TMatrix<double>::set(&aa_2,1,1.0);
  tfs::TMatrix<double>::set(&aa_2,2,2.0);
  pdVar7 = tfs::TMatrix<double>::operator[](&bb_2,0);
  *pdVar7 = 0.0;
  pdVar7 = tfs::TMatrix<double>::operator[](&bb_2,1);
  *pdVar7 = 1.0;
  pdVar7 = tfs::TMatrix<double>::operator[](&bb_2,2);
  *pdVar7 = 2.0;
  bVar4 = tfs::TMatrix<double>::equal(&aa_2,&bb_2);
  uVar16 = 0xa6;
  if (bVar4) {
    tfs::TMatrix<double>::normalize(&aa_2);
    pdVar7 = tfs::TMatrix<double>::operator[](&bb_2,1);
    *pdVar7 = 0.3333333333333333;
    pdVar7 = tfs::TMatrix<double>::operator[](&bb_2,2);
    *pdVar7 = 0.6666666666666666;
    bVar4 = tfs::TMatrix<double>::equal(&aa_2,&bb_2);
    uVar16 = 0xac;
    if (!bVar4) goto LAB_00111212;
    tfs::TMatrix<double>::multiply(&aa_2,3.0);
    tfs::TMatrix<double>::divide(&bb_2,0.3333333333333333);
    bVar4 = tfs::TMatrix<double>::equal(&aa_2,&bb_2);
    uVar16 = 0xb1;
    if (!bVar4) goto LAB_00111212;
    tfs::TMatrix<double>::~TMatrix(&bb_2);
    tfs::TMatrix<double>::~TMatrix(&aa_2);
  }
  else {
LAB_00111212:
    bVar4 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixMath2",uVar16,"aa && bb matrices are not the same."
                               );
    tfs::TMatrix<double>::~TMatrix(&bb_2);
    tfs::TMatrix<double>::~TMatrix(&aa_2);
    if (!bVar4) {
      return false;
    }
  }
  tfs::TMatrix<double>::TMatrix(&aa_2,3,2,1,1);
  dVar1 = 0.0;
  for (; aa_2.m_data < aa_2.m_end; aa_2.m_data = aa_2.m_data + 1) {
    dVar1 = dVar1 + 1.0;
    *aa_2.m_data = dVar1;
  }
  tfs::TMatrix<double>::TMatrix(&bb_2,&aa_2,true);
  bVar4 = tfs::TMatrix<double>::equal(&aa_2,&bb_2);
  if (bVar4) {
    tfs::TMatrix<double>::randomize(&bb_2);
    bVar4 = tfs::TMatrix<double>::equal(&aa_2,&bb_2);
    if (bVar4) {
      pcVar12 = "aa && bb matrices are the same.";
      uVar16 = 0xc9;
      goto LAB_001112ef;
    }
    tfs::TMatrix<double>::TMatrix(&cc_2,1,2,3,1);
    tfs::TMatrix<double>::copy(&cc_2,(EVP_PKEY_CTX *)&aa_2,src);
    bVar4 = tfs::TMatrix<double>::equal(&aa_2,&cc_2);
    if (bVar4) {
      bVar4 = tfs::report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                  ,"localTestMatrixCopy",0xcf,"aa && cc matrices are the same.");
    }
    else {
      tfs::TMatrix<double>::TMatrix(&local_80,&cc_2,false);
      tfs::TMatrix<double>::copy(&local_80,(EVP_PKEY_CTX *)&aa_2,src_00);
      bVar5 = tfs::TMatrix<double>::equal(&cc_2,&local_80);
      bVar4 = true;
      if (!bVar5) {
        bVar4 = tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                    ,"localTestMatrixCopy",0xd4,
                                    "cc && dd matrices are not the same.");
      }
      tfs::TMatrix<double>::~TMatrix(&local_80);
    }
    tfs::TMatrix<double>::~TMatrix(&cc_2);
  }
  else {
    pcVar12 = "aa && bb matrices are not the same.";
    uVar16 = 0xc4;
LAB_001112ef:
    bVar4 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixCopy",uVar16,pcVar12);
  }
  tfs::TMatrix<double>::~TMatrix(&bb_2);
  tfs::TMatrix<double>::~TMatrix(&aa_2);
  if (bVar4 == false) {
    return false;
  }
  tfs::TMatrix<double>::TMatrix(&aa_2,10,10,3,2);
  tfs::TMatrix<double>::TMatrix(&bb_2,10,10,3,2);
  tfs::fill(&aa_2);
  tfs::fill(&bb_2);
  bVar4 = tfs::TMatrix<double>::equal(&aa_2,&bb_2);
  if (bVar4) {
    tfs::TMatrix<double>::set(&bb_2,5,5,1,1,3.1415926);
    bVar4 = tfs::TMatrix<double>::equal(&aa_2,&bb_2);
    if (!bVar4) {
      tfs::TMatrix<double>::~TMatrix(&bb_2);
      tfs::TMatrix<double>::~TMatrix(&aa_2);
      goto LAB_00111518;
    }
    pcVar12 = "matrices are different, but reporting as equal";
    uVar16 = 0xf9;
  }
  else {
    pcVar12 = "matrices are equal, but reporting as different";
    uVar16 = 0xf5;
  }
  bVar4 = tfs::report_problem("Error",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                              ,"localTestMatrixEqual",uVar16,pcVar12);
  tfs::TMatrix<double>::~TMatrix(&bb_2);
  tfs::TMatrix<double>::~TMatrix(&aa_2);
  if (!bVar4) {
    return false;
  }
LAB_00111518:
  tfs::TMatrix<double>::TMatrix(&aa_2,4,4,3,1);
  tfs::TMatrix<double>::TMatrix(&bb_2,2,2,3,1);
  tfs::fill(&aa_2);
  if ((bb_2.m_data != (double *)0x0) && (bb_2.m_length != 0)) {
    memset(bb_2.m_data,0,bb_2.m_length);
  }
  bVar4 = tfs::subsample(&bb_2,&aa_2,1,1);
  if (bVar4) {
    for (uVar16 = 0; uVar16 != bb_2.m_c; uVar16 = uVar16 + 1) {
      uVar15 = 0;
      while (uVar14 = uVar15, uVar14 != bb_2.m_b) {
        uVar15 = 0;
        while (uVar13 = uVar15, uVar15 = uVar14 + 1, bb_2.m_a != uVar13) {
          dVar1 = tfs::TMatrix<double>::get(&aa_2,uVar13 + 1,uVar14 + 1,uVar16);
          dVar2 = tfs::TMatrix<double>::get(&bb_2,uVar13,uVar14,uVar16);
          if ((dVar1 != dVar2) || (uVar15 = uVar13 + 1, NAN(dVar1) || NAN(dVar2))) {
            bVar4 = tfs::report_problem("Error",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                        ,"localTestMatrixSubsample",0x114,
                                        "Values do not match: %f/%f, %lu, %lu, %lu",uVar13,uVar14,
                                        uVar16);
            goto LAB_00111665;
          }
        }
      }
    }
    bVar4 = tfs::subsample(&bb_2,&aa_2,1,2);
    if (bVar4) {
      for (uVar16 = 0; uVar16 != bb_2.m_c; uVar16 = uVar16 + 1) {
        for (uVar15 = 0; uVar15 != bb_2.m_b; uVar15 = uVar15 + 1) {
          uVar14 = 0;
          while (uVar13 = uVar14, bb_2.m_a != uVar13) {
            dVar1 = tfs::TMatrix<double>::get(&aa_2,uVar13 + 1,uVar15 + 2,uVar16);
            dVar2 = tfs::TMatrix<double>::get(&bb_2,uVar13,uVar15,uVar16);
            if ((dVar1 != dVar2) || (uVar14 = uVar13 + 1, NAN(dVar1) || NAN(dVar2))) {
              bVar4 = tfs::report_problem("Error",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                          ,"localTestMatrixSubsample",0x124,
                                          "Values do not match: %f/%f, %lu, %lu, %lu",uVar13,uVar15,
                                          uVar16);
              goto LAB_00111665;
            }
          }
        }
      }
      bVar4 = tfs::subsample(&bb_2,&aa_2,0,0);
      if (bVar4) {
        uVar16 = 0;
        do {
          if (uVar16 == bb_2.m_c) {
            tfs::TMatrix<double>::~TMatrix(&bb_2);
            tfs::TMatrix<double>::~TMatrix(&aa_2);
LAB_00111683:
            tfs::report_message("Info ",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrix",0x152,"Test Matrix - End");
            return true;
          }
          for (uVar15 = 0; uVar15 != bb_2.m_b; uVar15 = uVar15 + 1) {
            for (uVar14 = 0; bb_2.m_a != uVar14; uVar14 = uVar14 + 1) {
              dVar1 = tfs::TMatrix<double>::get(&aa_2,uVar14,uVar15,uVar16);
              dVar2 = tfs::TMatrix<double>::get(&bb_2,uVar14,uVar15,uVar16);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                bVar4 = tfs::report_problem("Error",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                            ,"localTestMatrixSubsample",0x134,
                                            "Values do not match: %f/%f, %lu, %lu, %lu",uVar14,
                                            uVar15,uVar16);
LAB_00111665:
                tfs::TMatrix<double>::~TMatrix(&bb_2);
                tfs::TMatrix<double>::~TMatrix(&aa_2);
                if (bVar4 == false) {
                  return false;
                }
                goto LAB_00111683;
              }
            }
          }
          uVar16 = uVar16 + 1;
        } while( true );
      }
    }
  }
  tfs::TMatrix<double>::~TMatrix(&bb_2);
  tfs::TMatrix<double>::~TMatrix(&aa_2);
  return false;
code_r0x00110d9b:
  dVar1 = *pdVar7;
  pdVar7 = pdVar7 + 1;
  if (dVar1 != 0.0) goto LAB_00110da6;
  goto LAB_00110d92;
}

Assistant:

static bool
    localTestMatrix( void ) {
        log_info( "Test Matrix - Start" );
        if( !localTestMatrixSize()) {
            return false;
        }
        if( !localTestMatrixMath()) {
            return false;
        }
        if( !localTestMatrixMath2()) {
            return false;
        }
        if( !localTestMatrixCopy()) {
            return false;
        }
        if( !localTestMatrixEqual()) {
            return false;
        }
        if( !localTestMatrixSubsample()) {
            return false;
        }
        log_info( "Test Matrix - End" );
        return true;
    }